

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

GeoSegment * geopolySegmentMerge(GeoSegment *pLeft,GeoSegment *pRight)

{
  double *in_RSI;
  double *in_RDI;
  long in_FS_OFFSET;
  double r;
  GeoSegment *pLast;
  GeoSegment head;
  double *local_68;
  double local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  double local_38 [5];
  GeoSegment *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_38,&DAT_002b12c0,0x30);
  local_10 = (GeoSegment *)0x0;
  local_50 = local_38;
  local_48 = in_RSI;
  local_40 = in_RDI;
  while (local_48 != (double *)0x0 && local_40 != (double *)0x0) {
    local_58 = local_48[2] - local_40[2];
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_58 = *local_48 - *local_40;
    }
    if (0.0 <= local_58) {
      local_50[5] = (double)local_40;
      local_50 = local_40;
      local_40 = (double *)local_40[5];
    }
    else {
      local_50[5] = (double)local_48;
      local_50 = local_48;
      local_48 = (double *)local_48[5];
    }
  }
  if (local_48 == (double *)0x0) {
    local_68 = local_40;
  }
  else {
    local_68 = local_48;
  }
  local_50[5] = (double)local_68;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static GeoSegment *geopolySegmentMerge(GeoSegment *pLeft, GeoSegment *pRight){
  GeoSegment head, *pLast;
  head.pNext = 0;
  pLast = &head;
  while( pRight && pLeft ){
    double r = pRight->y - pLeft->y;
    if( r==0.0 ) r = pRight->C - pLeft->C;
    if( r<0.0 ){
      pLast->pNext = pRight;
      pLast = pRight;
      pRight = pRight->pNext;
    }else{
      pLast->pNext = pLeft;
      pLast = pLeft;
      pLeft = pLeft->pNext;
    }
  }
  pLast->pNext = pRight ? pRight : pLeft;
  return head.pNext;
}